

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DbCheckPostLower.cpp
# Opt level: O3

void __thiscall DbCheckPostLower::EnsureOnlyMovesToRegisterOpnd(DbCheckPostLower *this,Instr *instr)

{
  IRKind IVar1;
  OpCode OVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  undefined4 *puVar6;
  char *message;
  Instr *pIVar7;
  uint lineNumber;
  undefined **ppuVar8;
  char *this_00;
  
  pIVar7 = instr;
  if ((instr->m_opcode == CALL) && (bVar4 = IR::Instr::HasLazyBailOut(instr), bVar4)) {
    ppuVar8 = &PTR_01548f08;
    puVar6 = (undefined4 *)__tls_get_addr();
    this_00 = (char *)ppuVar8;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    this_00 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
    ;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                       ,0x156,"(instr->m_opcode == Js::OpCode::CALL && instr->HasLazyBailOut())",
                       "instr->m_opcode == Js::OpCode::CALL && instr->HasLazyBailOut()");
    if (!bVar4) {
LAB_0040330f:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
LAB_0040316e:
  do {
    while( true ) {
      do {
        pIVar7 = pIVar7->m_next;
        IVar1 = pIVar7->m_kind;
        if ((((IVar1 == InstrKindLabel) || (IVar1 == InstrKindProfiledLabel)) ||
            (OVar2 = pIVar7->m_opcode, OVar2 == CMP)) || ((OVar2 == JMP || (OVar2 == TEST)))) {
          EnsureValidEndBoundary((DbCheckPostLower *)this_00,pIVar7);
          return;
        }
      } while (IVar1 == InstrKindPragma);
      this_00 = (char *)pIVar7;
      bVar4 = LowererMD::IsAssign(pIVar7);
      if ((bVar4) || (pIVar7->m_opcode == MOVQ)) goto LAB_004031c8;
      bVar4 = IsCallToHelper((DbCheckPostLower *)this_00,instr,HelperOp_Typeof);
      if (!bVar4) break;
      bVar4 = IsCallToHelper((DbCheckPostLower *)this_00,pIVar7,HelperOp_Equal);
      if ((((!bVar4) &&
           (bVar4 = IsCallToHelper((DbCheckPostLower *)this_00,pIVar7,HelperOp_StrictEqual), !bVar4)
           ) && (bVar4 = IsCallToHelper((DbCheckPostLower *)this_00,pIVar7,HelperOP_CmEq_A), !bVar4)
          ) && (bVar4 = IsCallToHelper((DbCheckPostLower *)this_00,pIVar7,HelperOP_CmNeq_A), !bVar4)
         ) {
        IR::Instr::Dump(pIVar7);
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        lineNumber = 0x177;
        message = "Nested helper call. Branch TypeOf/Equal doesn\'t match.";
        goto LAB_004032e4;
      }
    }
  } while (pIVar7->m_opcode == LEA);
  IR::Instr::Dump(pIVar7);
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  *puVar6 = 1;
  lineNumber = 0x181;
  message = "Nested helper call. Not assignment after CALL.";
  goto LAB_004032e4;
LAB_004031c8:
  this_00 = (char *)pIVar7->m_dst;
  OVar5 = IR::Opnd::GetKind((Opnd *)this_00);
  if ((OVar5 == OpndKindReg) || (pIVar7->m_noLazyHelperAssert != false)) goto LAB_0040316e;
  IR::Instr::Dump(pIVar7);
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  *puVar6 = 1;
  lineNumber = 0x166;
  message = "Nested helper call. Non-register operand for destination.";
LAB_004032e4:
  this_00 = 
  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
  ;
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                     ,lineNumber,"(false)",message);
  if (!bVar4) goto LAB_0040330f;
  *puVar6 = 0;
  goto LAB_0040316e;
}

Assistant:

void
DbCheckPostLower::EnsureOnlyMovesToRegisterOpnd(IR::Instr *instr)
{
    IR::Instr *startingCallInstrSequence = instr;
    Assert(instr->m_opcode == Js::OpCode::CALL && instr->HasLazyBailOut());
    instr = instr->m_next;
    while (!this->IsEndBoundary(instr))
    {
        if (!instr->IsPragmaInstr())
        {
            if (this->IsAssign(instr))
            {
                if (!instr->GetDst()->IsRegOpnd())
                {
                    // Instructions such as Op_SetElementI with LazyBailOut are
                    // followed by a MOV to re-enable implicit calls, don't throw
                    // in such cases.
                    if (!instr->m_noLazyHelperAssert)
                    {
                        instr->Dump();
                        AssertMsg(false, "Nested helper call. Non-register operand for destination.");
                    }
                }
            }
            else if (this->IsCallToHelper(startingCallInstrSequence, IR::HelperOp_Typeof))
            {
                if (this->IsCallToHelper(instr, IR::HelperOp_Equal) ||
                    this->IsCallToHelper(instr, IR::HelperOp_StrictEqual) ||
                    this->IsCallToHelper(instr, IR::HelperOP_CmEq_A) ||
                    this->IsCallToHelper(instr, IR::HelperOP_CmNeq_A)
                    )
                {
                    // Pattern matched
                }
                else
                {
                    instr->Dump();
                    AssertMsg(false, "Nested helper call. Branch TypeOf/Equal doesn't match.");
                }
            }
            else if (instr->m_opcode == Js::OpCode::LEA)
            {
                // Skip, this is probably NewScArray
            }
            else
            {
                instr->Dump();
                AssertMsg(false, "Nested helper call. Not assignment after CALL.");
            }
        }

        instr = instr->m_next;
    }

    this->EnsureValidEndBoundary(instr);
}